

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bss_test.cc
# Opt level: O0

int test_set_resource_business_status(void)

{
  code *pcVar1;
  char *__s;
  BssSetResourceBusinessStatusRequestType *pBVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1d1;
  int ret;
  HttpTestListener *local_1b0;
  HttpTestListener *listener;
  string local_1a0;
  allocator<char> local_179;
  string local_178 [39];
  allocator<char> local_151;
  string local_150 [55];
  allocator<char> local_119;
  string local_118 [32];
  BssSetResourceBusinessStatusRequestType *local_f8;
  Bss *bss;
  undefined1 local_e8 [7];
  BssSetResourceBusinessStatusResponseType resp;
  BssSetResourceBusinessStatusRequestType req;
  
  aliyun::BssSetResourceBusinessStatusRequestType::BssSetResourceBusinessStatusRequestType
            ((BssSetResourceBusinessStatusRequestType *)local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"cn-hangzhou",&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_150,"my_appid",&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_178,"my_secret",&local_179);
  pBVar2 = (BssSetResourceBusinessStatusRequestType *)
           aliyun::Bss::CreateBssClient(local_118,local_150,local_178);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  local_f8 = pBVar2;
  if (pBVar2 == (BssSetResourceBusinessStatusRequestType *)0x0) {
    aliyun::BssSetResourceBusinessStatusRequestType::~BssSetResourceBusinessStatusRequestType
              ((BssSetResourceBusinessStatusRequestType *)local_e8);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Bss::SetProxyHost((Bss *)pBVar2,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Bss::SetUseTls((Bss *)local_f8,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_set_resource_business_status_response;
  local_1b0 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1d1);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1d1);
  HttpTestListener::Start(local_1b0);
  std::__cxx11::string::operator=((string *)local_e8,"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"ResourceType");
  std::__cxx11::string::operator=
            ((string *)(req.resource_type.field_2._M_local_buf + 8),"ResourceId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_id.field_2._M_local_buf + 8),"BusinessStatus");
  std::__cxx11::string::operator=
            ((string *)(req.business_status.field_2._M_local_buf + 8),"OwnerAccount");
  aliyun::Bss::SetResourceBusinessStatus
            (local_f8,(BssSetResourceBusinessStatusResponseType *)local_e8,
             (BssErrorInfo *)((long)&bss + 7));
  HttpTestListener::WaitComplete(local_1b0);
  pHVar3 = local_1b0;
  if (local_1b0 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_1b0);
    operator_delete(pHVar3,0x180);
  }
  pBVar2 = local_f8;
  if (local_f8 != (BssSetResourceBusinessStatusRequestType *)0x0) {
    aliyun::Bss::~Bss((Bss *)local_f8);
    operator_delete(pBVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_set_resource_business_status() {
  BssSetResourceBusinessStatusRequestType req;
  BssSetResourceBusinessStatusResponseType resp;
  Bss* bss = Bss::CreateBssClient("cn-hangzhou", "my_appid", "my_secret");
  if(!bss) return 0;
  bss->SetProxyHost("127.0.0.1:12234");
  bss->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_set_resource_business_status_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.resource_type = "ResourceType";
  req.resource_id = "ResourceId";
  req.business_status = "BusinessStatus";
  req.owner_account = "OwnerAccount";
  int ret = bss->SetResourceBusinessStatus(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete bss;
}